

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.c
# Opt level: O3

void duckdb_shell_sqlite3StrAccumInit(StrAccum *p,void *db,char *zBase,int n,int mx)

{
  p->zText = zBase;
  p->db = db;
  p->nAlloc = n;
  p->mxAlloc = mx;
  p->nChar = 0;
  p->accError = '\0';
  p->printfFlags = '\0';
  return;
}

Assistant:

void sqlite3StrAccumInit(StrAccum *p, void *db, char *zBase, int n, int mx) {
	p->zText = zBase;
	assert(!db);
	p->db = db;
	p->nAlloc = n;
	p->mxAlloc = mx;
	p->nChar = 0;
	p->accError = 0;
	p->printfFlags = 0;
}